

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::dec_e(CPU *this)

{
  dec_r8(this,&this->regs->e);
  return 1;
}

Assistant:

int CPU::dec_e() {
    dec_r8(regs.e);
    return 1;
}